

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O2

decNumber * uprv_decNumberMax_63(decNumber *res,decNumber *lhs,decNumber *rhs,decContext *set)

{
  uint32_t status;
  
  status = 0;
  decCompareOp(res,lhs,rhs,set,'\x02',&status);
  if (status != 0) {
    decStatus(res,status,set);
  }
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberMax(decNumber *res, const decNumber *lhs,
                         const decNumber *rhs, decContext *set) {
  uInt status=0;                        /* accumulator  */
  decCompareOp(res, lhs, rhs, set, COMPMAX, &status);
  if (status!=0) decStatus(res, status, set);
  #if DECCHECK
  decCheckInexact(res, set);
  #endif
  return res;
  }